

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *axes_order,
          uint *param_2)

{
  uint uVar1;
  uint uVar2;
  uint size_z;
  byte bVar3;
  CImgArgumentException *this_00;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  uint *puVar16;
  long lVar17;
  bool bVar18;
  CImg<unsigned_int> local_68;
  uchar s_code [4];
  uchar n_code [4];
  
  puVar16 = this->_data;
  uVar1 = this->_width;
  uVar2 = this->_height;
  size_z = this->_depth;
  bVar18 = true;
  if ((size_z != 0 && uVar2 != 0) && (uVar1 != 0 && puVar16 != (uint *)0x0)) {
    bVar18 = this->_spectrum == 0;
  }
  if ((axes_order == (char *)0x0) || (bVar18)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  local_68._data = (uint *)0x0;
  local_68._width = 0;
  local_68._height = 0;
  local_68._depth = 0;
  local_68._spectrum = 0;
  local_68._is_shared = false;
  s_code[0] = '\0';
  s_code[1] = '\x01';
  s_code[2] = '\x02';
  s_code[3] = '\x03';
  n_code[0] = '\0';
  n_code[1] = '\0';
  n_code[2] = '\0';
  n_code[3] = '\0';
  bVar9 = *axes_order;
  if (bVar9 != 0) {
    lVar5 = 0;
    do {
      bVar3 = bVar9 + 0x20;
      if ((byte)(bVar9 + 0xa5) < 0xe6) {
        bVar3 = bVar9;
      }
      uVar4 = (uint)bVar3;
      if ((lVar5 == 4) || ((2 < uVar4 - 0x78 && (uVar4 != 99)))) {
        s_code[0] = '\x04';
        break;
      }
      n_code[uVar4 & 3] = n_code[uVar4 & 3] + '\x01';
      s_code[lVar5] = (uchar)(uVar4 & 3);
      bVar9 = axes_order[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (bVar9 != 0);
  }
  if (((((*axes_order == '\0') || (3 < s_code[0])) || (1 < n_code[0])) ||
      ((1 < n_code[1] || (1 < n_code[2])))) || (1 < n_code[3])) goto LAB_001a0b2f;
  uVar4 = (uint)s_code >> 0x18 |
          ((uint)s_code >> 0x10 & 0xff) << 4 | ((uint)s_code >> 8 & 0xff) << 8 |
          ((uint)s_code & 0xff) << 0xc;
  if (0x2012 < uVar4) {
    if (uVar4 < 0x3012) {
      if (uVar4 < 0x2130) {
        if (uVar4 == 0x2013) {
          assign(&local_68,size_z,uVar1,uVar2,this->_spectrum);
          if (0 < (int)this->_spectrum) {
            lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
            lVar7 = 0;
            do {
              if (0 < (int)this->_depth) {
                iVar8 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar10 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        iVar14 = 0;
                        do {
                          uVar1 = *puVar16;
                          puVar16 = puVar16 + 1;
                          local_68._data
                          [(local_68._8_8_ & 0xffffffff) * lVar5 * lVar7 +
                           lVar5 * lVar10 + (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < (int)this->_width);
                      }
                      lVar10 = lVar10 + 1;
                    } while (lVar10 < (int)this->_height);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < (int)this->_depth);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)this->_spectrum);
          }
        }
        else if (uVar4 == 0x2031) {
          assign(&local_68,size_z,uVar1,this->_spectrum,uVar2);
          if (0 < (int)this->_spectrum) {
            lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
            lVar7 = 0;
            do {
              if (0 < (int)this->_depth) {
                iVar8 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar10 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        iVar14 = 0;
                        do {
                          uVar1 = *puVar16;
                          puVar16 = puVar16 + 1;
                          local_68._data
                          [lVar5 * lVar7 +
                           (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                           (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < (int)this->_width);
                      }
                      lVar10 = lVar10 + 1;
                    } while (lVar10 < (int)this->_height);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < (int)this->_depth);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)this->_spectrum);
          }
        }
        else if ((uVar4 == 0x2103) &&
                (assign(&local_68,size_z,uVar2,uVar1,this->_spectrum), 0 < (int)this->_spectrum)) {
          lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
          lVar7 = 0;
          lVar10 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar8 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar14 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar11 = 0;
                      lVar17 = 0;
                      lVar15 = (long)local_68._data + lVar7;
                      do {
                        *(uint *)(lVar15 + (ulong)(local_68._width * iVar14 + iVar8) * 4) =
                             puVar16[lVar17];
                        lVar17 = lVar17 + 1;
                        lVar15 = lVar15 + lVar5 * 4;
                        lVar11 = lVar11 + 4;
                      } while (lVar17 < (int)this->_width);
                      puVar16 = (uint *)((long)puVar16 + lVar11);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)this->_height);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < (int)this->_depth);
            }
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
          } while (lVar10 < (int)this->_spectrum);
        }
      }
      else if (uVar4 == 0x2130) {
        assign(&local_68,size_z,uVar2,this->_spectrum,uVar1);
        if (0 < (int)this->_spectrum) {
          lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
          lVar7 = 0;
          lVar10 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar8 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar14 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar11 = 0;
                      lVar17 = 0;
                      lVar15 = (long)local_68._data + lVar7;
                      do {
                        *(uint *)(lVar15 + (ulong)(local_68._width * iVar14 + iVar8) * 4) =
                             puVar16[lVar17];
                        lVar17 = lVar17 + 1;
                        lVar15 = lVar15 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
                        lVar11 = lVar11 + 4;
                      } while (lVar17 < (int)this->_width);
                      puVar16 = (uint *)((long)puVar16 + lVar11);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)this->_height);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < (int)this->_depth);
            }
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + lVar5 * 4;
          } while (lVar10 < (int)this->_spectrum);
        }
      }
      else if (uVar4 == 0x2301) {
        assign(&local_68,size_z,this->_spectrum,uVar1,uVar2);
        if (0 < (int)this->_spectrum) {
          lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
          iVar8 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar14 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar7 = 0;
                  puVar6 = local_68._data;
                  do {
                    if (0 < (int)this->_width) {
                      lVar10 = 0;
                      lVar15 = 0;
                      puVar12 = puVar6;
                      do {
                        puVar12[local_68._width * iVar8 + iVar14] = puVar16[lVar15];
                        lVar15 = lVar15 + 1;
                        puVar12 = puVar12 + lVar5;
                        lVar10 = lVar10 + 4;
                      } while (lVar15 < (int)this->_width);
                      puVar16 = (uint *)((long)puVar16 + lVar10);
                    }
                    lVar7 = lVar7 + 1;
                    puVar6 = puVar6 + (local_68._8_8_ & 0xffffffff) * lVar5;
                  } while (lVar7 < (int)this->_height);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)this->_depth);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)this->_spectrum);
        }
      }
      else if ((uVar4 == 0x2310) &&
              (assign(&local_68,size_z,this->_spectrum,uVar2,uVar1), 0 < (int)this->_spectrum)) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar14 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar7 = 0;
                puVar6 = local_68._data;
                do {
                  if (0 < (int)this->_width) {
                    lVar10 = 0;
                    lVar15 = 0;
                    puVar12 = puVar6;
                    do {
                      puVar12[local_68._width * iVar8 + iVar14] = puVar16[lVar15];
                      lVar15 = lVar15 + 1;
                      puVar12 = puVar12 + (local_68._8_8_ & 0xffffffff) * lVar5;
                      lVar10 = lVar10 + 4;
                    } while (lVar15 < (int)this->_width);
                    puVar16 = (uint *)((long)puVar16 + lVar10);
                  }
                  lVar7 = lVar7 + 1;
                  puVar6 = puVar6 + lVar5;
                } while (lVar7 < (int)this->_height);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar4 < 0x3120) {
      if (uVar4 == 0x3012) {
        assign(&local_68,this->_spectrum,uVar1,uVar2,size_z);
        switch(this->_spectrum) {
        case 1:
          lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar5 != 0) {
            puVar16 = this->_data;
            lVar7 = 0;
            do {
              local_68._data[lVar7] = puVar16[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar5 - lVar7 != 0);
          }
          break;
        case 2:
          lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar5 != 0) {
            puVar16 = this->_data;
            lVar7 = 0;
            do {
              local_68._data[lVar7 * 2] = puVar16[lVar7];
              local_68._data[lVar7 * 2 + 1] = puVar16[lVar5 + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar5 - lVar7 != 0);
          }
          break;
        case 3:
          lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar5 != 0) {
            puVar16 = this->_data;
            lVar7 = 0;
            puVar6 = local_68._data;
            do {
              *puVar6 = puVar16[lVar7];
              puVar6[1] = puVar16[lVar5 + lVar7];
              puVar6[2] = puVar16[lVar5 * 2 + lVar7];
              puVar6 = puVar6 + 3;
              lVar7 = lVar7 + 1;
            } while (lVar5 - lVar7 != 0);
          }
          break;
        case 4:
          lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar5 != 0) {
            puVar16 = this->_data;
            lVar7 = 0;
            puVar6 = local_68._data;
            do {
              *puVar6 = puVar16[lVar7];
              puVar6[1] = puVar16[lVar5 + lVar7];
              puVar6[2] = puVar16[lVar5 * 2 + lVar7];
              puVar6[3] = puVar16[lVar5 * 3 + lVar7];
              puVar6 = puVar6 + 4;
              lVar7 = lVar7 + 1;
            } while (lVar5 - lVar7 != 0);
          }
          break;
        default:
          if (0 < (int)this->_spectrum) {
            lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
            iVar8 = 0;
            do {
              if (0 < (int)this->_depth) {
                lVar7 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar10 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        iVar14 = 0;
                        do {
                          uVar1 = *puVar16;
                          puVar16 = puVar16 + 1;
                          local_68._data
                          [(local_68._8_8_ & 0xffffffff) * lVar5 * lVar7 +
                           lVar5 * lVar10 + (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < (int)this->_width);
                      }
                      lVar10 = lVar10 + 1;
                    } while (lVar10 < (int)this->_height);
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < (int)this->_depth);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < (int)this->_spectrum);
          }
        }
      }
      else if (uVar4 == 0x3021) {
        assign(&local_68,this->_spectrum,uVar1,size_z,uVar2);
        if (0 < (int)this->_spectrum) {
          lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
          iVar8 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar10 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      iVar14 = 0;
                      do {
                        uVar1 = *puVar16;
                        puVar16 = puVar16 + 1;
                        local_68._data
                        [lVar5 * lVar7 +
                         (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                         (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                        iVar14 = iVar14 + 1;
                      } while (iVar14 < (int)this->_width);
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < (int)this->_height);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_depth);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)this->_spectrum);
        }
      }
      else if ((uVar4 == 0x3102) &&
              (assign(&local_68,this->_spectrum,uVar2,uVar1,size_z), 0 < (int)this->_spectrum)) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar7 = 0;
            lVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar14 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar11 = 0;
                    lVar17 = 0;
                    lVar15 = (long)local_68._data + lVar7;
                    do {
                      *(uint *)(lVar15 + (ulong)(local_68._width * iVar14 + iVar8) * 4) =
                           puVar16[lVar17];
                      lVar17 = lVar17 + 1;
                      lVar15 = lVar15 + lVar5 * 4;
                      lVar11 = lVar11 + 4;
                    } while (lVar17 < (int)this->_width);
                    puVar16 = (uint *)((long)puVar16 + lVar11);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)this->_height);
              }
              lVar10 = lVar10 + 1;
              lVar7 = lVar7 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
            } while (lVar10 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar4 == 0x3120) {
      assign(&local_68,this->_spectrum,uVar2,size_z,uVar1);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar7 = 0;
            lVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar14 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar11 = 0;
                    lVar17 = 0;
                    lVar15 = (long)local_68._data + lVar7;
                    do {
                      *(uint *)(lVar15 + (ulong)(local_68._width * iVar14 + iVar8) * 4) =
                           puVar16[lVar17];
                      lVar17 = lVar17 + 1;
                      lVar15 = lVar15 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
                      lVar11 = lVar11 + 4;
                    } while (lVar17 < (int)this->_width);
                    puVar16 = (uint *)((long)puVar16 + lVar11);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)this->_height);
              }
              lVar10 = lVar10 + 1;
              lVar7 = lVar7 + lVar5 * 4;
            } while (lVar10 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar4 == 0x3201) {
      assign(&local_68,this->_spectrum,size_z,uVar1,uVar2);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar14 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar7 = 0;
                puVar6 = local_68._data;
                do {
                  if (0 < (int)this->_width) {
                    lVar10 = 0;
                    lVar15 = 0;
                    puVar12 = puVar6;
                    do {
                      puVar12[local_68._width * iVar14 + iVar8] = puVar16[lVar15];
                      lVar15 = lVar15 + 1;
                      puVar12 = puVar12 + lVar5;
                      lVar10 = lVar10 + 4;
                    } while (lVar15 < (int)this->_width);
                    puVar16 = (uint *)((long)puVar16 + lVar10);
                  }
                  lVar7 = lVar7 + 1;
                  puVar6 = puVar6 + (local_68._8_8_ & 0xffffffff) * lVar5;
                } while (lVar7 < (int)this->_height);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if ((uVar4 == 0x3210) &&
            (assign(&local_68,this->_spectrum,size_z,uVar2,uVar1), 0 < (int)this->_spectrum)) {
      lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
      iVar8 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar14 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              puVar6 = local_68._data;
              do {
                if (0 < (int)this->_width) {
                  lVar10 = 0;
                  lVar15 = 0;
                  puVar12 = puVar6;
                  do {
                    puVar12[local_68._width * iVar14 + iVar8] = puVar16[lVar15];
                    lVar15 = lVar15 + 1;
                    puVar12 = puVar12 + (local_68._8_8_ & 0xffffffff) * lVar5;
                    lVar10 = lVar10 + 4;
                  } while (lVar15 < (int)this->_width);
                  puVar16 = (uint *)((long)puVar16 + lVar10);
                }
                lVar7 = lVar7 + 1;
                puVar6 = puVar6 + lVar5;
              } while (lVar7 < (int)this->_height);
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)this->_depth);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < (int)this->_spectrum);
    }
    goto LAB_001a0b2f;
  }
  if (uVar4 < 0x1023) {
    if (uVar4 < 0x231) {
      if (uVar4 == 0x123) {
        CImg(__return_storage_ptr__,this,false);
        goto LAB_001a0b9e;
      }
      if (uVar4 == 0x132) {
        assign(&local_68,uVar1,uVar2,this->_spectrum,size_z);
        if (0 < (int)this->_spectrum) {
          lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
          lVar7 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar10 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar8 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      iVar14 = 0;
                      do {
                        uVar1 = *puVar16;
                        puVar16 = puVar16 + 1;
                        local_68._data
                        [lVar5 * lVar7 +
                         (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                         (ulong)(local_68._width * iVar8 + iVar14)] = uVar1;
                        iVar14 = iVar14 + 1;
                      } while (iVar14 < (int)this->_width);
                    }
                    iVar8 = iVar8 + 1;
                  } while (iVar8 < (int)this->_height);
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < (int)this->_depth);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_spectrum);
        }
      }
      else if ((uVar4 == 0x213) &&
              (assign(&local_68,uVar1,size_z,uVar2,this->_spectrum), 0 < (int)this->_spectrum)) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        lVar7 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar8 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    iVar14 = 0;
                    do {
                      uVar1 = *puVar16;
                      puVar16 = puVar16 + 1;
                      local_68._data
                      [(local_68._8_8_ & 0xffffffff) * lVar5 * lVar7 +
                       lVar5 * lVar10 + (ulong)(local_68._width * iVar8 + iVar14)] = uVar1;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)this->_width);
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (int)this->_height);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < (int)this->_depth);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)this->_spectrum);
      }
    }
    else if (uVar4 == 0x231) {
      assign(&local_68,uVar1,size_z,this->_spectrum,uVar2);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        lVar7 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar8 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    iVar14 = 0;
                    do {
                      uVar1 = *puVar16;
                      puVar16 = puVar16 + 1;
                      local_68._data
                      [lVar5 * lVar7 +
                       (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                       (ulong)(local_68._width * iVar8 + iVar14)] = uVar1;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)this->_width);
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (int)this->_height);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < (int)this->_depth);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)this->_spectrum);
      }
    }
    else if (uVar4 == 0x312) {
      assign(&local_68,uVar1,this->_spectrum,uVar2,size_z);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar7 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    iVar14 = 0;
                    do {
                      uVar1 = *puVar16;
                      puVar16 = puVar16 + 1;
                      local_68._data
                      [(local_68._8_8_ & 0xffffffff) * lVar5 * lVar7 +
                       lVar5 * lVar10 + (ulong)(local_68._width * iVar8 + iVar14)] = uVar1;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)this->_width);
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (int)this->_height);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if ((uVar4 == 0x321) &&
            (assign(&local_68,uVar1,this->_spectrum,size_z,uVar2), 0 < (int)this->_spectrum)) {
      lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
      iVar8 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar14 = 0;
                  do {
                    uVar1 = *puVar16;
                    puVar16 = puVar16 + 1;
                    local_68._data
                    [lVar5 * lVar7 +
                     (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                     (ulong)(local_68._width * iVar8 + iVar14)] = uVar1;
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)this->_width);
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < (int)this->_spectrum);
    }
    goto LAB_001a0b2f;
  }
  if (uVar4 < 0x1230) {
    if (uVar4 == 0x1023) {
      assign(&local_68,uVar2,uVar1,size_z,this->_spectrum);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        lVar7 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar8 = 0;
                do {
                  if (0 < (int)this->_width) {
                    iVar14 = 0;
                    do {
                      uVar1 = *puVar16;
                      puVar16 = puVar16 + 1;
                      local_68._data
                      [lVar5 * lVar10 +
                       (local_68._8_8_ & 0xffffffff) * lVar5 * lVar7 +
                       (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)this->_width);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < (int)this->_height);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)this->_depth);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)this->_spectrum);
      }
    }
    else if (uVar4 == 0x1032) {
      assign(&local_68,uVar2,uVar1,this->_spectrum,size_z);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        lVar7 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar8 = 0;
                do {
                  if (0 < (int)this->_width) {
                    iVar14 = 0;
                    do {
                      uVar1 = *puVar16;
                      puVar16 = puVar16 + 1;
                      local_68._data
                      [lVar5 * lVar7 +
                       (local_68._8_8_ & 0xffffffff) * lVar5 * lVar10 +
                       (ulong)(local_68._width * iVar14 + iVar8)] = uVar1;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)this->_width);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < (int)this->_height);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)this->_depth);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)this->_spectrum);
      }
    }
    else if ((uVar4 == 0x1203) &&
            (assign(&local_68,uVar2,size_z,uVar1,this->_spectrum), 0 < (int)this->_spectrum)) {
      lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
      lVar7 = 0;
      lVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar8 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar14 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar11 = 0;
                  lVar17 = 0;
                  lVar15 = (long)local_68._data + lVar7;
                  do {
                    *(uint *)(lVar15 + (ulong)(local_68._width * iVar8 + iVar14) * 4) =
                         puVar16[lVar17];
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + lVar5 * 4;
                    lVar11 = lVar11 + 4;
                  } while (lVar17 < (int)this->_width);
                  puVar16 = (uint *)((long)puVar16 + lVar11);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)this->_height);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)this->_depth);
        }
        lVar10 = lVar10 + 1;
        lVar7 = lVar7 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
      } while (lVar10 < (int)this->_spectrum);
    }
    goto LAB_001a0b2f;
  }
  if (uVar4 != 0x1230) {
    if (uVar4 == 0x1302) {
      assign(&local_68,uVar2,this->_spectrum,uVar1,size_z);
      if (0 < (int)this->_spectrum) {
        lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
        iVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar7 = 0;
            lVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar14 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar11 = 0;
                    lVar17 = 0;
                    lVar15 = (long)local_68._data + lVar7;
                    do {
                      *(uint *)(lVar15 + (ulong)(local_68._width * iVar8 + iVar14) * 4) =
                           puVar16[lVar17];
                      lVar17 = lVar17 + 1;
                      lVar15 = lVar15 + lVar5 * 4;
                      lVar11 = lVar11 + 4;
                    } while (lVar17 < (int)this->_width);
                    puVar16 = (uint *)((long)puVar16 + lVar11);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)this->_height);
              }
              lVar10 = lVar10 + 1;
              lVar7 = lVar7 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
            } while (lVar10 < (int)this->_depth);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)this->_spectrum);
      }
    }
    else if ((uVar4 == 0x1320) &&
            (assign(&local_68,uVar2,this->_spectrum,size_z,uVar1), 0 < (int)this->_spectrum)) {
      lVar5 = ((ulong)local_68._0_8_ >> 0x20) * (local_68._0_8_ & 0xffffffff);
      iVar8 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          lVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar14 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar11 = 0;
                  lVar17 = 0;
                  lVar15 = (long)local_68._data + lVar7;
                  do {
                    *(uint *)(lVar15 + (ulong)(local_68._width * iVar8 + iVar14) * 4) =
                         puVar16[lVar17];
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
                    lVar11 = lVar11 + 4;
                  } while (lVar17 < (int)this->_width);
                  puVar16 = (uint *)((long)puVar16 + lVar11);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)this->_height);
            }
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + lVar5 * 4;
          } while (lVar10 < (int)this->_depth);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < (int)this->_spectrum);
    }
    goto LAB_001a0b2f;
  }
  assign(&local_68,uVar2,size_z,this->_spectrum,uVar1);
  switch(this->_width) {
  case 1:
    iVar8 = this->_depth * this->_height * this->_spectrum;
    if (iVar8 != 0) {
      lVar5 = 0;
      do {
        local_68._data[lVar5] = puVar16[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar8 != (int)lVar5);
    }
    break;
  case 2:
    iVar8 = this->_depth * this->_height * this->_spectrum;
    if (iVar8 != 0) {
      lVar5 = 0;
      do {
        local_68._data[lVar5] = puVar16[lVar5 * 2];
        local_68._data
        [(local_68._8_8_ & 0xffffffff) * (local_68._0_8_ & 0xffffffff) * (ulong)local_68._height +
         lVar5] = puVar16[lVar5 * 2 + 1];
        lVar5 = lVar5 + 1;
      } while (iVar8 != (int)lVar5);
    }
    break;
  case 3:
    iVar8 = this->_depth * this->_height * this->_spectrum;
    if (iVar8 != 0) {
      lVar5 = (local_68._8_8_ & 0xffffffff) *
              (local_68._0_8_ & 0xffffffff) * (ulong)local_68._height;
      lVar7 = 0;
      do {
        local_68._data[lVar7] = *puVar16;
        local_68._data[lVar5 + lVar7] = puVar16[1];
        local_68._data[lVar5 * 2 + lVar7] = puVar16[2];
        puVar16 = puVar16 + 3;
        lVar7 = lVar7 + 1;
      } while (iVar8 != (int)lVar7);
    }
    break;
  case 4:
    iVar8 = this->_depth * this->_height * this->_spectrum;
    if (iVar8 != 0) {
      lVar5 = (local_68._8_8_ & 0xffffffff) *
              (local_68._0_8_ & 0xffffffff) * (ulong)local_68._height;
      lVar7 = 0;
      do {
        local_68._data[lVar7] = *puVar16;
        local_68._data[lVar5 + lVar7] = puVar16[1];
        local_68._data[lVar5 * 2 + lVar7] = puVar16[2];
        local_68._data[lVar5 * 3 + lVar7] = puVar16[3];
        puVar16 = puVar16 + 4;
        lVar7 = lVar7 + 1;
      } while (iVar8 != (int)lVar7);
    }
    break;
  default:
    if (0 < (int)this->_spectrum) {
      lVar5 = (ulong)local_68._height * (local_68._0_8_ & 0xffffffff);
      lVar7 = 0;
      lVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar8 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar14 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar11 = 0;
                  lVar17 = 0;
                  lVar15 = (long)local_68._data + lVar7;
                  do {
                    *(uint *)(lVar15 + (ulong)(local_68._width * iVar8 + iVar14) * 4) =
                         puVar16[lVar17];
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + (local_68._8_8_ & 0xffffffff) * lVar5 * 4;
                    lVar11 = lVar11 + 4;
                  } while (lVar17 < (int)this->_width);
                  puVar16 = (uint *)((long)puVar16 + lVar11);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)this->_height);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (int)this->_depth);
        }
        lVar10 = lVar10 + 1;
        lVar7 = lVar7 + lVar5 * 4;
      } while (lVar10 < (int)this->_spectrum);
    }
    __return_storage_ptr__->_data = (uint *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
    __return_storage_ptr__->_width = local_68._width;
    uVar1 = __return_storage_ptr__->_height;
    __return_storage_ptr__->_height = local_68._height;
    local_68._0_8_ = (ulong)uVar1 << 0x20;
    uVar1 = __return_storage_ptr__->_depth;
    __return_storage_ptr__->_depth = local_68._depth;
    uVar2 = __return_storage_ptr__->_spectrum;
    __return_storage_ptr__->_spectrum = local_68._spectrum;
    local_68._spectrum = uVar2;
    local_68._depth = uVar1;
    goto LAB_001a0b83;
  }
LAB_001a0b2f:
  if (local_68._data == (uint *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar13 = "non-";
    if (this->_is_shared != false) {
      pcVar13 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar13,"unsigned int",axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __return_storage_ptr__->_data = (uint *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  uVar1 = __return_storage_ptr__->_width;
  __return_storage_ptr__->_width = local_68._width;
  uVar2 = __return_storage_ptr__->_height;
  __return_storage_ptr__->_height = local_68._height;
  local_68._height = uVar2;
  local_68._width = uVar1;
  uVar1 = __return_storage_ptr__->_depth;
  __return_storage_ptr__->_depth = local_68._depth;
  uVar2 = __return_storage_ptr__->_spectrum;
  __return_storage_ptr__->_spectrum = local_68._spectrum;
  local_68._spectrum = uVar2;
  local_68._depth = uVar1;
LAB_001a0b83:
  __return_storage_ptr__->_data = local_68._data;
  local_68._data = (uint *)0x0;
  bVar18 = __return_storage_ptr__->_is_shared;
  __return_storage_ptr__->_is_shared = local_68._is_shared;
  local_68._is_shared = bVar18;
LAB_001a0b9e:
  if ((local_68._is_shared == false) && (local_68._data != (uint *)0x0)) {
    operator_delete__(local_68._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }